

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
* anon_unknown.dwarf_47aea5::GetKeyOriginData(FlatSigningProvider *provider,int flags)

{
  Span<const_unsigned_char> _vch;
  bool bVar1;
  uint in_EDX;
  set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>,_bool> pVar2;
  type *data;
  type *_;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range1;
  set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  *ret;
  const_iterator __end1;
  const_iterator __begin1;
  KeyOriginInfo norm_origin;
  CPubKey norm_pubkey;
  uchar bytes [33];
  char *in_stack_fffffffffffffdf8;
  value_type *in_stack_fffffffffffffe00;
  KeyOriginInfo *in_stack_fffffffffffffe08;
  CPubKey *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  _Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_> in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  _Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_> in_stack_fffffffffffffe30;
  unit_test_log_t *in_stack_fffffffffffffe38;
  value_type local_128;
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  unit_test_log_t local_a0 [13];
  undefined1 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ::set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
         *)in_stack_fffffffffffffdf8);
  local_128.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                         *)in_stack_fffffffffffffe00);
  local_128.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                       *)in_stack_fffffffffffffe00);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe08,
                                 (_Self *)in_stack_fffffffffffffe00), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
               *)in_stack_fffffffffffffdf8);
    std::get<0ul,CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>
              ((pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *)in_stack_fffffffffffffdf8);
    std::get<1ul,CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>
              ((pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *)in_stack_fffffffffffffdf8);
    if ((in_EDX & 0x40) == 0) {
      pVar2 = std::
              set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
              ::insert((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                        *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe20 = pVar2.first._M_node;
      in_stack_fffffffffffffe1f = pVar2.second;
      local_c0 = in_stack_fffffffffffffe20._M_node;
      local_b8 = in_stack_fffffffffffffe1f;
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
                   (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffe38,(const_string *)in_stack_fffffffffffffe30._M_node,
                   CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   (const_string *)in_stack_fffffffffffffe20._M_node);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
                   (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
        local_128.first.vch._4_4_ = CPubKey::size((CPubKey *)in_stack_fffffffffffffdf8);
        local_128.first.vch[0] = '!';
        local_128.first.vch[1] = '\0';
        local_128.first.vch[2] = '\0';
        local_128.first.vch[3] = '\0';
        in_stack_fffffffffffffe08 = (KeyOriginInfo *)0x1c13f67;
        in_stack_fffffffffffffe00 = &local_128;
        in_stack_fffffffffffffdf8 = "data.first.size()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_128.first.vch + 0x18,local_128.first.vch + 8,0x77,1,2,
                   local_128.first.vch + 4);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffdf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      CPubKey::begin((CPubKey *)in_stack_fffffffffffffdf8);
      CPubKey::end((CPubKey *)in_stack_fffffffffffffe08);
      std::copy<unsigned_char_const*,unsigned_char*>
                ((uchar *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10->vch,in_stack_fffffffffffffe08->fingerprint);
      local_38 = 2;
      Span<const_unsigned_char>::Span<33>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffdf8,(uchar (*) [33])0x62cc7d);
      _vch.m_size._0_7_ = in_stack_fffffffffffffe18;
      _vch.m_data = in_stack_fffffffffffffe10->vch;
      _vch.m_size._7_1_ = in_stack_fffffffffffffe1f;
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe08,_vch);
      KeyOriginInfo::KeyOriginInfo
                ((KeyOriginInfo *)in_stack_fffffffffffffdf8,(KeyOriginInfo *)0x62ccb5);
      in_stack_fffffffffffffe38 = local_a0;
      std::begin<unsigned_char,4ul>((uchar (*) [4])in_stack_fffffffffffffdf8);
      std::end<unsigned_char,4ul>((uchar (*) [4])in_stack_fffffffffffffdf8);
      std::fill<unsigned_char*,int>
                (in_stack_fffffffffffffe08->fingerprint,(uchar *)in_stack_fffffffffffffe00,
                 (int *)in_stack_fffffffffffffdf8);
      pVar2 = std::
              set<std::pair<CPubKey,KeyOriginInfo>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
              ::emplace<CPubKey&,KeyOriginInfo&>
                        ((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe30 = pVar2.first._M_node;
      in_stack_fffffffffffffe2f = pVar2.second;
      local_b0 = in_stack_fffffffffffffe30._M_node;
      local_a8 = in_stack_fffffffffffffe2f;
      KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffdf8);
    }
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)in_stack_fffffffffffffdf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::set<std::pair<CPubKey, KeyOriginInfo>> GetKeyOriginData(const FlatSigningProvider& provider, int flags) {
    std::set<std::pair<CPubKey, KeyOriginInfo>> ret;
    for (const auto& [_, data] : provider.origins) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(data.first.size(), 33);
            std::copy(data.first.begin(), data.first.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            KeyOriginInfo norm_origin = data.second;
            std::fill(std::begin(norm_origin.fingerprint), std::end(norm_origin.fingerprint), 0); // fingerprints don't necessarily match.
            ret.emplace(norm_pubkey, norm_origin);
        } else {
            ret.insert(data);
        }
    }
    return ret;
}